

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_RESTORE_STAT(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  wchar_t stat;
  player *p;
  char *pcVar2;
  ulong uVar3;
  
  stat = context->subtype;
  uVar3 = (ulong)(uint)stat;
  context->ident = true;
  p = player;
  if (uVar3 < 5) {
    if (player->stat_cur[uVar3] != player->stat_max[uVar3]) {
      player->stat_cur[uVar3] = player->stat_max[uVar3];
      puVar1 = &p->upkeep->update;
      *puVar1 = *puVar1 | 1;
      update_stuff(p);
      pcVar2 = desc_stat(stat,false);
      msg("You feel less %s.",pcVar2);
    }
  }
  return (uint)stat < 5;
}

Assistant:

bool effect_handler_RESTORE_STAT(effect_handler_context_t *context)
{
	int stat = context->subtype;

	/* ID */
	context->ident = true;

	/* Check bounds */
	if (stat < 0 || stat >= STAT_MAX) return false;

	/* Not needed */
	if (player->stat_cur[stat] == player->stat_max[stat])
		return true;

	/* Restore */
	player->stat_cur[stat] = player->stat_max[stat];

	/* Recalculate bonuses */
	player->upkeep->update |= (PU_BONUS);
	update_stuff(player);

	/* Message */
	msg("You feel less %s.", desc_stat(stat, false));

	return (true);
}